

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Data_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::Minefield_Data_PDU::AddSensorType(Minefield_Data_PDU *this,SensorType ST)

{
  KUINT16 *pKVar1;
  unsigned_short local_a;
  
  local_a = (unsigned_short)ST;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
            (&this->m_vui16SensorTypes,&local_a);
  pKVar1 = &(this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 + 2;
  this->m_ui8NumSensTyp = this->m_ui8NumSensTyp + '\x01';
  return;
}

Assistant:

void Minefield_Data_PDU::AddSensorType( SensorType ST )
{
    m_vui16SensorTypes.push_back( ST );
    m_ui16PDULength += 2; // 16 bit enum. = 2 octets
    ++m_ui8NumSensTyp;
}